

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

void __thiscall
Board::undo_move(Board *this,Point *source,Point *destination,shared_ptr<Piece> *original)

{
  long *plVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  pvVar3 = (this->m_board).m_data.
           super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = *(long *)&pvVar3[destination->m_x].
                    super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
  ;
  lVar10 = (long)destination->m_y * 0x10;
  lVar11 = *(long *)(lVar4 + lVar10);
  plVar1 = (long *)(lVar11 + 0x18);
  *plVar1 = *plVar1 + -8;
  lVar5 = *(long *)&pvVar3[source->m_x].
                    super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
  ;
  lVar12 = (long)source->m_y * 0x10;
  uVar6 = *(undefined8 *)(lVar4 + 8 + lVar10);
  *(undefined8 *)(lVar4 + lVar10) = 0;
  ((undefined8 *)(lVar4 + lVar10))[1] = 0;
  *(long *)(lVar5 + lVar12) = lVar11;
  p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar5 + 8 + lVar12);
  *(undefined8 *)(lVar5 + 8 + lVar12) = uVar6;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  lVar4 = *(long *)&(this->m_board).m_data.
                    super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[destination->m_x].
                    super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
  ;
  lVar11 = (long)destination->m_y * 0x10;
  peVar8 = (original->super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var9 = (original->super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (original->super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (original->super___shared_ptr<Piece,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar4 + 8 + lVar11);
  puVar2 = (undefined8 *)(lVar4 + lVar11);
  *puVar2 = peVar8;
  puVar2[1] = p_Var9;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    return;
  }
  return;
}

Assistant:

void Board::undo_move(const Point &source, const Point &destination, shared_ptr<Piece> original) {
    m_board[destination]->undo_last_move();
    m_board[source] = move(m_board[destination]);
    // Revive the previous piece if such exists.
    m_board[destination] = move(original);
}